

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O0

void jinit_master_decompress(j_decompress_ptr cinfo)

{
  jpeg_decomp_master *pjVar1;
  my_master_ptr_conflict master;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = (jpeg_decomp_master *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x30);
  cinfo->master = pjVar1;
  pjVar1->prepare_for_output_pass = prepare_for_output_pass;
  pjVar1->finish_output_pass = finish_output_pass;
  pjVar1->is_dummy_pass = 0;
  master_selection(cinfo);
  return;
}

Assistant:

GLOBAL(void)
jinit_master_decompress (j_decompress_ptr cinfo)
{
  my_master_ptr master;

  master = (my_master_ptr)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(my_decomp_master));
  cinfo->master = (struct jpeg_decomp_master *) master;
  master->pub.prepare_for_output_pass = prepare_for_output_pass;
  master->pub.finish_output_pass = finish_output_pass;

  master->pub.is_dummy_pass = FALSE;

  master_selection(cinfo);
}